

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O0

void __thiscall
vkt::Draw::anon_unknown_0::
DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndexedIndirectParams>::generateDrawData
          (DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndexedIndirectParams> *this)

{
  allocator<vkt::Draw::PositionColorVertex> *this_00;
  deUint32 dVar1;
  deUint32 dVar2;
  value_type vVar3;
  bool bVar4;
  value_type vVar5;
  uint uVar6;
  reference pvVar7;
  ulong __n;
  pointer pVVar8;
  reference pvVar9;
  pointer pPVar10;
  float fVar11;
  float fVar12;
  float z_;
  float w_;
  uint local_1c8;
  uint local_1a4;
  Vector<float,_4> local_190;
  undefined1 local_180 [8];
  VecAccess<float,_4,_4> colorAccess;
  undefined1 local_158 [8];
  VecAccess<float,_4,_4> positionAccess;
  __normal_iterator<vkt::Draw::PositionColorVertex_*,_std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>_>
  local_138;
  __normal_iterator<vkt::Draw::PositionColorVertex_*,_std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>_>
  local_130;
  iterator vertexIt;
  deUint32 idx_1;
  deUint32 lastIdx;
  deUint32 firstIdx;
  __normal_iterator<vk::VkDrawIndexedIndirectCommand_*,_std::vector<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>_>
  local_110;
  __normal_iterator<const_vk::VkDrawIndexedIndirectCommand_*,_std::vector<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>_>
  local_108;
  const_iterator cmdIt;
  Vector<float,_4> local_f8;
  Vector<float,_4> local_e8;
  PositionColorVertex local_d8;
  vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_> local_b8;
  uint local_9c;
  value_type local_98;
  deUint32 maxIndex;
  deUint32 vertexIdx;
  deUint32 idx;
  __normal_iterator<vk::VkDrawIndexedIndirectCommand_*,_std::vector<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>_>
  local_88;
  __normal_iterator<const_vk::VkDrawIndexedIndirectCommand_*,_std::vector<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>_>
  local_80;
  const_iterator it_1;
  deUint32 highestIndex;
  allocator<unsigned_int> local_65;
  value_type_conflict2 local_64;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  uint local_44;
  iterator iStack_40;
  deUint32 index;
  __normal_iterator<vk::VkDrawIndexedIndirectCommand_*,_std::vector<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>_>
  local_38;
  __normal_iterator<const_vk::VkDrawIndexedIndirectCommand_*,_std::vector<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>_>
  local_30;
  const_iterator it;
  undefined1 local_20 [4];
  deUint32 lastIndex;
  Random rnd;
  DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndexedIndirectParams> *this_local;
  
  rnd.m_rnd._8_8_ = this;
  pvVar7 = std::
           vector<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
           ::operator[](&(this->m_data).commands,0);
  uVar6 = pvVar7->firstIndex;
  pvVar7 = std::
           vector<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
           ::operator[](&(this->m_data).commands,0);
  de::Random::Random((Random *)local_20,uVar6 ^ 0xc2a39f ^ pvVar7->indexCount);
  it._M_current._4_4_ = 0;
  local_38._M_current =
       (VkDrawIndexedIndirectCommand *)
       std::
       vector<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>::
       begin(&(this->m_data).commands);
  __gnu_cxx::
  __normal_iterator<vk::VkDrawIndexedIndirectCommand_const*,std::vector<vk::VkDrawIndexedIndirectCommand,std::allocator<vk::VkDrawIndexedIndirectCommand>>>
  ::__normal_iterator<vk::VkDrawIndexedIndirectCommand*>
            ((__normal_iterator<vk::VkDrawIndexedIndirectCommand_const*,std::vector<vk::VkDrawIndexedIndirectCommand,std::allocator<vk::VkDrawIndexedIndirectCommand>>>
              *)&local_30,&local_38);
  while( true ) {
    iStack_40 = std::
                vector<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
                ::end(&(this->m_data).commands);
    bVar4 = __gnu_cxx::operator!=(&local_30,&stack0xffffffffffffffc0);
    if (!bVar4) break;
    pVVar8 = __gnu_cxx::
             __normal_iterator<const_vk::VkDrawIndexedIndirectCommand_*,_std::vector<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>_>
             ::operator->(&local_30);
    dVar1 = pVVar8->firstIndex;
    pVVar8 = __gnu_cxx::
             __normal_iterator<const_vk::VkDrawIndexedIndirectCommand_*,_std::vector<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>_>
             ::operator->(&local_30);
    local_44 = dVar1 + pVVar8->indexCount;
    local_1a4 = local_44;
    if (local_44 <= it._M_current._4_4_) {
      local_1a4 = it._M_current._4_4_;
    }
    it._M_current._4_4_ = local_1a4;
    __gnu_cxx::
    __normal_iterator<const_vk::VkDrawIndexedIndirectCommand_*,_std::vector<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>_>
    ::operator++(&local_30);
  }
  __n = (ulong)it._M_current._4_4_;
  local_64 = 0;
  std::allocator<unsigned_int>::allocator(&local_65);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_60,__n,&local_64,&local_65);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&(this->m_data).super_IndexedParamsBase.indexes,&local_60);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_60);
  std::allocator<unsigned_int>::~allocator(&local_65);
  it_1._M_current._0_4_ = 0;
  local_88._M_current =
       (VkDrawIndexedIndirectCommand *)
       std::
       vector<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>::
       begin(&(this->m_data).commands);
  __gnu_cxx::
  __normal_iterator<vk::VkDrawIndexedIndirectCommand_const*,std::vector<vk::VkDrawIndexedIndirectCommand,std::allocator<vk::VkDrawIndexedIndirectCommand>>>
  ::__normal_iterator<vk::VkDrawIndexedIndirectCommand*>
            ((__normal_iterator<vk::VkDrawIndexedIndirectCommand_const*,std::vector<vk::VkDrawIndexedIndirectCommand,std::allocator<vk::VkDrawIndexedIndirectCommand>>>
              *)&local_80,&local_88);
  while( true ) {
    _vertexIdx = std::
                 vector<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
                 ::end(&(this->m_data).commands);
    bVar4 = __gnu_cxx::operator!=
                      (&local_80,
                       (__normal_iterator<vk::VkDrawIndexedIndirectCommand_*,_std::vector<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>_>
                        *)&vertexIdx);
    if (!bVar4) break;
    for (maxIndex = 0; dVar1 = maxIndex,
        pVVar8 = __gnu_cxx::
                 __normal_iterator<const_vk::VkDrawIndexedIndirectCommand_*,_std::vector<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>_>
                 ::operator->(&local_80), dVar1 < pVVar8->indexCount; maxIndex = maxIndex + 1) {
      pVVar8 = __gnu_cxx::
               __normal_iterator<const_vk::VkDrawIndexedIndirectCommand_*,_std::vector<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>_>
               ::operator->(&local_80);
      vVar5 = de::Random::getInt((Random *)local_20,pVVar8->vertexOffset,10000);
      local_98 = vVar5;
      pVVar8 = __gnu_cxx::
               __normal_iterator<const_vk::VkDrawIndexedIndirectCommand_*,_std::vector<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>_>
               ::operator->(&local_80);
      vVar3 = local_98;
      local_9c = vVar5 + pVVar8->vertexOffset;
      local_1c8 = local_9c;
      if (local_9c <= (uint)it_1._M_current) {
        local_1c8 = (uint)it_1._M_current;
      }
      it_1._M_current._0_4_ = local_1c8;
      pVVar8 = __gnu_cxx::
               __normal_iterator<const_vk::VkDrawIndexedIndirectCommand_*,_std::vector<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>_>
               ::operator->(&local_80);
      pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&(this->m_data).super_IndexedParamsBase.indexes,
                          (ulong)(pVVar8->firstIndex + maxIndex));
      *pvVar9 = vVar3;
    }
    __gnu_cxx::
    __normal_iterator<const_vk::VkDrawIndexedIndirectCommand_*,_std::vector<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>_>
    ::operator++(&local_80);
  }
  uVar6 = (uint)it_1._M_current + 1;
  tcu::Vector<float,_4>::Vector(&local_e8,0.0,0.0,0.0,0.0);
  tcu::Vector<float,_4>::Vector(&local_f8,0.0,0.0,0.0,0.0);
  PositionColorVertex::PositionColorVertex(&local_d8,&local_e8,&local_f8);
  this_00 = (allocator<vkt::Draw::PositionColorVertex> *)((long)&cmdIt._M_current + 7);
  std::allocator<vkt::Draw::PositionColorVertex>::allocator(this_00);
  std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>::
  vector(&local_b8,(ulong)uVar6,&local_d8,this_00);
  std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>::
  operator=((vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
             *)&this->m_data,&local_b8);
  std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>::
  ~vector(&local_b8);
  std::allocator<vkt::Draw::PositionColorVertex>::~allocator
            ((allocator<vkt::Draw::PositionColorVertex> *)((long)&cmdIt._M_current + 7));
  local_110._M_current =
       (VkDrawIndexedIndirectCommand *)
       std::
       vector<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>::
       begin(&(this->m_data).commands);
  __gnu_cxx::
  __normal_iterator<vk::VkDrawIndexedIndirectCommand_const*,std::vector<vk::VkDrawIndexedIndirectCommand,std::allocator<vk::VkDrawIndexedIndirectCommand>>>
  ::__normal_iterator<vk::VkDrawIndexedIndirectCommand*>
            ((__normal_iterator<vk::VkDrawIndexedIndirectCommand_const*,std::vector<vk::VkDrawIndexedIndirectCommand,std::allocator<vk::VkDrawIndexedIndirectCommand>>>
              *)&local_108,&local_110);
  while( true ) {
    _lastIdx = std::
               vector<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
               ::end(&(this->m_data).commands);
    bVar4 = __gnu_cxx::operator!=
                      (&local_108,
                       (__normal_iterator<vk::VkDrawIndexedIndirectCommand_*,_std::vector<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>_>
                        *)&lastIdx);
    if (!bVar4) break;
    pVVar8 = __gnu_cxx::
             __normal_iterator<const_vk::VkDrawIndexedIndirectCommand_*,_std::vector<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>_>
             ::operator->(&local_108);
    dVar1 = pVVar8->firstIndex;
    pVVar8 = __gnu_cxx::
             __normal_iterator<const_vk::VkDrawIndexedIndirectCommand_*,_std::vector<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>_>
             ::operator->(&local_108);
    dVar2 = pVVar8->indexCount;
    for (vertexIt._M_current._4_4_ = dVar1; vertexIt._M_current._4_4_ < dVar1 + dVar2;
        vertexIt._M_current._4_4_ = vertexIt._M_current._4_4_ + 1) {
      positionAccess.m_index._8_8_ =
           std::
           vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>::
           begin((vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                  *)&this->m_data);
      pVVar8 = __gnu_cxx::
               __normal_iterator<const_vk::VkDrawIndexedIndirectCommand_*,_std::vector<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>_>
               ::operator->(&local_108);
      local_138 = __gnu_cxx::
                  __normal_iterator<vkt::Draw::PositionColorVertex_*,_std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>_>
                  ::operator+((__normal_iterator<vkt::Draw::PositionColorVertex_*,_std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>_>
                               *)(positionAccess.m_index + 2),(long)pVVar8->vertexOffset);
      pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&(this->m_data).super_IndexedParamsBase.indexes,
                          (ulong)vertexIt._M_current._4_4_);
      local_130 = __gnu_cxx::
                  __normal_iterator<vkt::Draw::PositionColorVertex_*,_std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>_>
                  ::operator+(&local_138,(ulong)*pvVar9);
      pPVar10 = __gnu_cxx::
                __normal_iterator<vkt::Draw::PositionColorVertex_*,_std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>_>
                ::operator->(&local_130);
      tcu::Vector<float,_4>::xyzw((VecAccess<float,_4,_4> *)local_158,&pPVar10->position);
      fVar11 = de::Random::getFloat((Random *)local_20,-1.0,1.0);
      fVar12 = de::Random::getFloat((Random *)local_20,-1.0,1.0);
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)(colorAccess.m_index + 2),fVar11,fVar12,1.0,1.0);
      tcu::VecAccess<float,_4,_4>::operator=
                ((VecAccess<float,_4,_4> *)local_158,(Vector<float,_4> *)(colorAccess.m_index + 2));
      pPVar10 = __gnu_cxx::
                __normal_iterator<vkt::Draw::PositionColorVertex_*,_std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>_>
                ::operator->(&local_130);
      tcu::Vector<float,_4>::xyzw((VecAccess<float,_4,_4> *)local_180,&pPVar10->color);
      fVar11 = de::Random::getFloat((Random *)local_20,0.0,1.0);
      fVar12 = de::Random::getFloat((Random *)local_20,0.0,1.0);
      z_ = de::Random::getFloat((Random *)local_20,0.0,1.0);
      w_ = de::Random::getFloat((Random *)local_20,0.0,1.0);
      tcu::Vector<float,_4>::Vector(&local_190,fVar11,fVar12,z_,w_);
      tcu::VecAccess<float,_4,_4>::operator=((VecAccess<float,_4,_4> *)local_180,&local_190);
    }
    __gnu_cxx::
    __normal_iterator<const_vk::VkDrawIndexedIndirectCommand_*,_std::vector<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>_>
    ::operator++(&local_108);
  }
  de::Random::~Random((Random *)local_20);
  return;
}

Assistant:

void DrawTestInstance<DrawIndexedIndirectParams>::generateDrawData (void)
{
	de::Random		rnd			(SEED ^ m_data.commands[0].firstIndex ^ m_data.commands[0].indexCount);

	deUint32		lastIndex	= 0;

	// Get the maximum range of indexes
	for (std::vector<vk::VkDrawIndexedIndirectCommand>::const_iterator it = m_data.commands.begin(); it != m_data.commands.end(); ++it)
	{
		const deUint32	index		= it->firstIndex + it->indexCount;
						lastIndex	= (index > lastIndex) ? index : lastIndex;
	}

	// Initialize the vector with zeros
	m_data.indexes = std::vector<deUint32>(lastIndex, 0);

	deUint32	highestIndex	= 0;

	// Generate random indexes for the ranges
	for (std::vector<vk::VkDrawIndexedIndirectCommand>::const_iterator it = m_data.commands.begin(); it != m_data.commands.end(); ++it)
	{
		for (deUint32 idx = 0; idx < it->indexCount; ++idx)
		{
			const deUint32	vertexIdx	= rnd.getInt(it->vertexOffset, INDEX_LIMIT);
			const deUint32	maxIndex	= vertexIdx + it->vertexOffset;

			highestIndex = (maxIndex > highestIndex) ? maxIndex : highestIndex;
			m_data.indexes[it->firstIndex + idx] = vertexIdx;
		}
	}

	// Initialize the vertex vector
	m_data.vertices = std::vector<PositionColorVertex>(highestIndex + 1, PositionColorVertex(tcu::Vec4(0.0, 0.0, 0.0, 0.0), tcu::Vec4(0.0, 0.0, 0.0, 0.0)));

	// Generate random vertices in the used locations
	for (std::vector<vk::VkDrawIndexedIndirectCommand>::const_iterator cmdIt = m_data.commands.begin(); cmdIt != m_data.commands.end(); ++cmdIt)
	{
		deUint32	firstIdx	= cmdIt->firstIndex;
		deUint32	lastIdx		= firstIdx + cmdIt->indexCount;

		for (deUint32 idx = firstIdx; idx < lastIdx; ++idx)
		{
			std::vector<PositionColorVertex>::iterator	vertexIt = m_data.vertices.begin() + cmdIt->vertexOffset + m_data.indexes[idx];

			tcu::VecAccess<float, 4, 4> positionAccess = vertexIt->position.xyzw();
			positionAccess = tcu::Vec4(rnd.getFloat(-1.0, 1.0), rnd.getFloat(-1.0, 1.0), 1.0, 1.0);

			tcu::VecAccess<float, 4, 4> colorAccess = vertexIt->color.xyzw();
			colorAccess = tcu::Vec4(rnd.getFloat(0.0, 1.0), rnd.getFloat(0.0, 1.0), rnd.getFloat(0.0, 1.0), rnd.getFloat(0.0, 1.0));
		}
	}
}